

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plot.hpp
# Opt level: O3

DrawSpecs * __thiscall
sciplot::Plot::drawWithVecs<std::valarray<double>,std::vector<double,std::allocator<double>>>
          (Plot *this,string *with,valarray<double> *x,vector<double,_std::allocator<double>_> *vecs
          )

{
  size_type *psVar1;
  pointer pcVar2;
  pointer pDVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  string use;
  ostringstream datastream;
  ulong *local_290;
  long local_288;
  ulong local_280;
  long lStack_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 *local_1f0;
  long local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  size_t local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  gnuplot::writedataset<std::valarray<double>,std::vector<double,std::allocator<double>>>
            ((ostream *)local_1a8,this->m_numdatasets,x,vecs);
  local_1e8 = 0;
  local_1e0 = 0;
  local_1f0 = &local_1e0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)&this->m_data,(ulong)local_290);
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  std::operator+(&local_1d0,"\'",&this->m_datafilename);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_280 = *puVar6;
    lStack_278 = plVar4[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *puVar6;
    local_290 = (ulong *)*plVar4;
  }
  local_288 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1b0 = this->m_numdatasets;
  this->m_numdatasets = local_1b0 + 1;
  internal::str<unsigned_long>(&local_250,&local_1b0);
  uVar7 = 0xf;
  if (local_290 != &local_280) {
    uVar7 = local_280;
  }
  if (uVar7 < local_250._M_string_length + local_288) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar8 = local_250.field_2._M_allocated_capacity;
    }
    if (local_250._M_string_length + local_288 <= (ulong)uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_290);
      goto LAB_0016c64b;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_250._M_dataplus._M_p);
LAB_0016c64b:
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_270.field_2._M_allocated_capacity = *psVar1;
    local_270.field_2._8_4_ = *(undefined4 *)(puVar5 + 3);
    local_270.field_2._12_4_ = *(undefined4 *)((long)puVar5 + 0x1c);
  }
  else {
    local_270.field_2._M_allocated_capacity = *psVar1;
    local_270._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_270._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_210,local_1f0,local_1f0 + local_1e8);
  pcVar2 = (with->_M_dataplus)._M_p;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,pcVar2,pcVar2 + with->_M_string_length);
  std::vector<sciplot::DrawSpecs,std::allocator<sciplot::DrawSpecs>>::
  emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
            ((vector<sciplot::DrawSpecs,std::allocator<sciplot::DrawSpecs>> *)&this->m_drawspecs,
             &local_270,&local_210,&local_230);
  pDVar3 = (this->m_drawspecs).
           super__Vector_base<sciplot::DrawSpecs,_std::allocator<sciplot::DrawSpecs>_>._M_impl.
           super__Vector_impl_data._M_finish;
  LineSpecsOf<sciplot::DrawSpecs>::lineStyle
            (&pDVar3[-1].super_LineSpecsOf<sciplot::DrawSpecs>,
             (int)((ulong)((long)pDVar3 -
                          (long)(this->m_drawspecs).
                                super__Vector_base<sciplot::DrawSpecs,_std::allocator<sciplot::DrawSpecs>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x6fd0eb67);
  pDVar3 = (this->m_drawspecs).
           super__Vector_base<sciplot::DrawSpecs,_std::allocator<sciplot::DrawSpecs>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return pDVar3 + -1;
}

Assistant:

inline auto Plot::drawWithVecs(std::string with, const X& x, const Vecs&... vecs) -> DrawSpecs&
{
    // Write the given vectors x and y as a new data set to the stream
    std::ostringstream datastream;
    gnuplot::writedataset(datastream, m_numdatasets, x, vecs...);

    // Set the using string to "" if X is not vector of strings.
    // Otherwise, x contain xtics strings. Set the `using` string
    // so that these are properly used as xtics.
    std::string use;
    if constexpr(internal::isStringVector<X>) {
        const auto nvecs = sizeof...(Vecs);
        use = "0:"; // here, column 0 means the pseudo column with numbers 0, 1, 2, 3...
        for(auto i = 2; i <= nvecs + 1; ++i)
            use += std::to_string(i) + ":"; // this constructs 0:2:3:4:
        use += "xtic(1)"; // this terminates the string with 0:2:3:4:xtic(1), and thus column 1 is used for the xtics
    }

    // Append new data set to existing data
    m_data += datastream.str();

    // Draw the data saved using a data set with index `m_numdatasets`. Increase number of data sets
    return draw("'" + m_datafilename + "' index " + internal::str(m_numdatasets++), use, with);
}